

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

BaseStatistics *
duckdb::NumericStats::CreateEmpty(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  Value VStack_68;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&local_28);
  LogicalType::~LogicalType(&local_28);
  __return_storage_ptr__->has_null = false;
  __return_storage_ptr__->has_no_null = true;
  Value::MaximumValue(&VStack_68,&__return_storage_ptr__->type);
  SetNumericValueInternal
            (&VStack_68,&__return_storage_ptr__->type,
             &(__return_storage_ptr__->stats_union).numeric_data.min,
             (bool *)&__return_storage_ptr__->stats_union);
  Value::~Value(&VStack_68);
  Value::MinimumValue(&VStack_68,&__return_storage_ptr__->type);
  SetNumericValueInternal
            (&VStack_68,&__return_storage_ptr__->type,
             &(__return_storage_ptr__->stats_union).numeric_data.max,
             &(__return_storage_ptr__->stats_union).numeric_data.has_max);
  Value::~Value(&VStack_68);
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics NumericStats::CreateEmpty(LogicalType type) {
	BaseStatistics result(std::move(type));
	result.InitializeEmpty();
	SetMin(result, Value::MaximumValue(result.GetType()));
	SetMax(result, Value::MinimumValue(result.GetType()));
	return result;
}